

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.h
# Opt level: O2

ChFseqNode * __thiscall chrono::ChFseqNode::operator=(ChFseqNode *this,ChFseqNode *param_1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  dVar1 = param_1->weight;
  dVar2 = param_1->t_start;
  dVar3 = param_1->t_end;
  uVar4 = *(undefined8 *)((long)&param_1->t_end + 3);
  uVar5 = *(undefined8 *)((long)&param_1->Iy + 3);
  uVar6 = *(undefined8 *)((long)&param_1->Iydt + 3);
  uVar7 = *(undefined8 *)((long)&param_1->Iydtdt + 3);
  this->duration = param_1->duration;
  this->weight = dVar1;
  this->t_start = dVar2;
  this->t_end = dVar3;
  *(undefined8 *)((long)&this->t_end + 3) = uVar4;
  *(undefined8 *)((long)&this->Iy + 3) = uVar5;
  *(undefined8 *)((long)&this->Iydt + 3) = uVar6;
  *(undefined8 *)((long)&this->Iydtdt + 3) = uVar7;
  return this;
}

Assistant:

class ChApi ChFseqNode {
  public:
    std::shared_ptr<ChFunction> fx;
    double duration;
    double weight;
    double t_start;
    double t_end;
    double Iy;
    double Iydt;
    double Iydtdt;
    bool y_cont;
    bool ydt_cont;
    bool ydtdt_cont;

    void SetDuration(double mdur);
    void SetTend(double mt_end) {
        t_end = mt_end;
        if (t_end < t_start)
            t_end = t_start;
        duration = t_end - t_start;
    }

    ChFseqNode();
    ChFseqNode(std::shared_ptr<ChFunction> myfx, double mdur);
    ChFseqNode(const ChFseqNode& other);
    ~ChFseqNode() {}

    /// Method to allow serialization of transient data to archives.
    void ArchiveOUT(ChArchiveOut& marchive);

    /// Method to allow de-serialization of transient data from archives.
    void ArchiveIN(ChArchiveIn& marchive);
}